

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

string * __thiscall CLI::Option::help_pname_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  ostream *poVar1;
  stringstream out;
  string local_1e0;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__cxx11::string::string(local_1c0,(string *)&this->pname_);
  poVar1 = ::std::operator<<(local_190,local_1c0);
  help_aftername_abi_cxx11_(&local_1e0,this);
  ::std::operator<<(poVar1,(string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  ::std::__cxx11::string::~string(local_1c0);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string help_pname() const {
        std::stringstream out;
        out << get_pname() << help_aftername();
        return out.str();
    }